

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O2

void nhdp_db_link_update_status(nhdp_link *lnk)

{
  int *piVar1;
  nhdp_link_status nVar2;
  nhdp_link_status nVar3;
  nhdp_neighbor *pnVar4;
  uint64_t uVar5;
  list_entity *plVar6;
  
  nVar2 = lnk->status;
  lnk->last_status = nVar2;
  nVar3 = _nhdp_db_link_calculate_status(lnk);
  lnk->status = nVar3;
  if (nVar3 == NHDP_LINK_SYMMETRIC || nVar2 != NHDP_LINK_SYMMETRIC) {
    if (nVar3 == NHDP_LINK_SYMMETRIC && nVar2 != NHDP_LINK_SYMMETRIC) {
      piVar1 = &lnk->neigh->symmetric;
      *piVar1 = *piVar1 + 1;
      pnVar4 = lnk->neigh;
      if (pnVar4->symmetric == 1) {
        plVar6 = &(pnVar4->_neigh_addresses).list_head;
        while (plVar6 = ((list_entity *)&plVar6->next)->next,
              plVar6->prev != (pnVar4->_neigh_addresses).list_head.prev) {
          oonf_timer_stop((oonf_timer_instance *)(plVar6 + -6));
          pnVar4 = lnk->neigh;
        }
        _neighbor_set_id = _neighbor_set_id + 1;
      }
    }
  }
  else {
    _link_status_not_symmetric_anymore(lnk);
  }
  nVar3 = lnk->status;
  if ((nVar3 != NHDP_LINK_SYMMETRIC) == (nVar2 == NHDP_LINK_SYMMETRIC)) {
    nhdp_interface_update_status(lnk->local_if);
    nVar3 = lnk->status;
  }
  if (nVar2 == nVar3) {
    return;
  }
  uVar5 = oonf_clock_getNow();
  lnk->last_status_change = uVar5;
  nhdp_domain_recalculate_metrics((nhdp_domain *)0x0,lnk->neigh);
  nhdp_domain_delayed_mpr_recalculation((nhdp_domain *)0x0,lnk->neigh);
  oonf_class_event(&_link_info,lnk,OONF_OBJECT_CHANGED);
  return;
}

Assistant:

void
nhdp_db_link_update_status(struct nhdp_link *lnk) {
  enum nhdp_link_status old_status;
  bool was_symmetric;

  old_status = lnk->status;
  was_symmetric = lnk->status == NHDP_LINK_SYMMETRIC;

  /* update link status */
  lnk->last_status = lnk->status;
  lnk->status = _nhdp_db_link_calculate_status(lnk);

  /* handle database changes */
  if (was_symmetric && lnk->status != NHDP_LINK_SYMMETRIC) {
    _link_status_not_symmetric_anymore(lnk);
  }
  if (!was_symmetric && lnk->status == NHDP_LINK_SYMMETRIC) {
    _link_status_now_symmetric(lnk);
  }

  /* trigger ip flooding interface settings recalculation */
  if (was_symmetric != (lnk->status == NHDP_LINK_SYMMETRIC)) {
    nhdp_interface_update_status(lnk->local_if);
  }

  if (old_status != lnk->status) {
    /* link status was changed */
    lnk->last_status_change = oonf_clock_getNow();
    nhdp_domain_recalculate_metrics(NULL, lnk->neigh);
    nhdp_domain_delayed_mpr_recalculation(NULL, lnk->neigh);

    /* trigger change event */
    oonf_class_event(&_link_info, lnk, OONF_OBJECT_CHANGED);
  }
}